

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O0

void __thiscall
PeptData::PeptData(PeptData *this,ProtData *proteins,EnzymeType enzyme_type,uint max_miss_cleavage,
                  double min_mass,double max_mass)

{
  void *__dest;
  initializer_list<std::pair<const_char,_double>_> __l;
  _Node_iterator<PPData::Peptide,_true,_true> __last;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  _Node_iterator_base<PPData::Peptide,_true> __first;
  vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *this_00;
  reference pPVar4;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined4 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  uint i;
  char *compact_sequence;
  Protein *protein;
  const_iterator __end1;
  const_iterator __begin1;
  ProtData *__range1;
  int index;
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  pool;
  size_t compact_size;
  int sequences_len_sum;
  ProtData *this_01;
  __normal_iterator<const_PPData::Peptide_*,_std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>_>
  *in_stack_fffffffffffffd20;
  key_equal *in_stack_fffffffffffffd28;
  hasher *in_stack_fffffffffffffd30;
  size_type in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  char cVar8;
  iterator in_stack_fffffffffffffd48;
  size_type in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  const_iterator __position;
  uint local_20c;
  __normal_iterator<const_PPData::Protein_*,_std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>_>
  local_1f0;
  char *compact_sequence_00;
  undefined4 in_stack_fffffffffffffe20;
  int iVar9;
  int iVar10;
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  *in_stack_fffffffffffffe28;
  PeptData *in_stack_fffffffffffffe30;
  ProtData local_16b [3];
  void *local_38;
  undefined8 local_30;
  char *local_10;
  
  *in_RDI = in_EDX;
  in_RDI[1] = in_ECX;
  *(undefined8 *)(in_RDI + 2) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 4) = in_XMM1_Qa;
  local_10 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x151ec1);
  std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>::vector
            ((vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *)0x151ed4);
  *(undefined8 *)(in_RDI + 0x12) = 0x3ff01dc725c3dee8;
  *(undefined8 *)(in_RDI + 0x14) = 0x3ff02007dd441355;
  *(undefined8 *)(in_RDI + 0x16) = 0x402ffd64d7f0ed3e;
  *(double *)(in_RDI + 0x18) =
       *(double *)(in_RDI + 0x16) + *(double *)(in_RDI + 0x14) + *(double *)(in_RDI + 0x14);
  __dest = (void *)((long)&local_16b[0].database_name_ + 3);
  memcpy(__dest,&DAT_0018c410,0x130);
  local_30 = 0x13;
  this_01 = local_16b;
  local_38 = __dest;
  std::allocator<std::pair<const_char,_double>_>::allocator
            ((allocator<std::pair<const_char,_double>_> *)0x151f78);
  __l._M_len = in_stack_fffffffffffffd50;
  __l._M_array = in_stack_fffffffffffffd48;
  std::
  unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
  ::unordered_map((unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),__l,
                  in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                  in_stack_fffffffffffffd60);
  std::allocator<std::pair<const_char,_double>_>::~allocator
            ((allocator<std::pair<const_char,_double>_> *)0x151fc6);
  cVar3 = ProtData::begin(this_01);
  __position._M_current = (Peptide *)cVar3;
  __first._M_cur = (__node_type *)ProtData::end(this_01);
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<PPData::Protein_const*,std::vector<PPData::Protein,std::allocator<PPData::Protein>>>,int,PeptData::PeptData(ProtData_const&,PPData::EnzymeType,unsigned_int,double,double)::_lambda(int_const&,PPData::Protein_const&)_1_>
                    (cVar3._M_current,__first._M_cur,0);
  this_00 = (vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *)
            ProtData::size((ProtData *)0x15204a);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             in_stack_fffffffffffffd38);
  std::
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  ::unordered_set((unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
                   *)0x15208b);
  iVar9 = 0;
  local_1f0._M_current = (Protein *)ProtData::begin(this_01);
  ProtData::end(this_01);
  compact_sequence_00 = local_10;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PPData::Protein_*,_std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<const_PPData::Protein_*,_std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>_>
                        *)this_01);
    if (!bVar1) break;
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_PPData::Protein_*,_std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>_>
             ::operator*(&local_1f0);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 6),(long)iVar9);
    iVar10 = iVar9;
    for (local_20c = 0; (ulong)local_20c < pPVar4->sequence_length; local_20c = local_20c + 1) {
      if (pPVar4->sequence[local_20c] == 'I') {
        cVar8 = 'L';
      }
      else {
        cVar8 = pPVar4->sequence[local_20c];
      }
      iVar9 = iVar10 + 1;
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 6),(long)iVar10);
      *pvVar5 = cVar8;
      iVar10 = iVar9;
    }
    iVar9 = iVar10 + 1;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 6),(long)iVar10);
    *pvVar5 = '\0';
    Digest(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
           (Protein *)CONCAT44(iVar9,in_stack_fffffffffffffe20),compact_sequence_00);
    __gnu_cxx::
    __normal_iterator<const_PPData::Protein_*,_std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>_>
    ::operator++(&local_1f0);
  }
  std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>::end
            ((vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *)this_01);
  __gnu_cxx::
  __normal_iterator<PPData::Peptide_const*,std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>>
  ::__normal_iterator<PPData::Peptide*>
            (in_stack_fffffffffffffd20,
             (__normal_iterator<PPData::Peptide_*,_std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>_>
              *)this_01);
  std::
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  ::begin((unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
           *)this_01);
  std::
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  ::end((unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
         *)this_01);
  __last.super__Node_iterator_base<PPData::Peptide,_true>._M_cur._4_4_ = iVar2;
  __last.super__Node_iterator_base<PPData::Peptide,_true>._M_cur._0_4_ = in_stack_fffffffffffffd68;
  std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>::
  insert<std::__detail::_Node_iterator<PPData::Peptide,true,true>,void>
            (this_00,__position,(_Node_iterator<PPData::Peptide,_true,_true>)__first._M_cur,__last);
  iVar6 = std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>::begin
                    ((vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *)this_01);
  iVar7 = std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>::end
                    ((vector<PPData::Peptide,_std::allocator<PPData::Peptide>_> *)this_01);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<PPData::Peptide*,std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>>,PeptData::PeptData(ProtData_const&,PPData::EnzymeType,unsigned_int,double,double)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar6._M_current,iVar7._M_current);
  std::
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  ::~unordered_set((unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
                    *)0x152387);
  return;
}

Assistant:

PeptData(const ProtData& proteins, EnzymeType enzyme_type, unsigned max_miss_cleavage,
             double min_mass, double max_mass)
            : enzyme_type_(enzyme_type), max_miss_cleavage_(max_miss_cleavage),
              min_mass_(min_mass), max_mass_(max_mass) {
        // calculate compact size
        auto sequences_len_sum = std::accumulate(proteins.begin(), proteins.end(), 0,
            [](const int& sum, const Protein& protein) {
                return sum + protein.sequence_length;
            }
        );
        auto compact_size = sequences_len_sum + proteins.size();  // append '\0' at the end of each sequence
        compact_sequences_.resize(compact_size);

        // build compact sequences and peptides
        std::unordered_set<Peptide> pool;
        int index = 0;
        for (auto& protein : proteins) {
            // fill compact sequence
            const char* compact_sequence = &compact_sequences_[index];
            for (unsigned i = 0; i < protein.sequence_length; ++i) {
                compact_sequences_[index++] = protein.sequence[i] == 'I' ? 'L' : protein.sequence[i];
            }  // prefer L
            compact_sequences_[index++] = '\0';

            // digest and build peptides into pool
            Digest(pool, protein, compact_sequence);
        }

        peptides_.insert(peptides_.end(), pool.begin(), pool.end());
        std::stable_sort(peptides_.begin(), peptides_.end(),
                  [](const auto& one, const auto& another) { return one.mass < another.mass; });
    }